

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::addStructBufferHiddenCounterParam
          (HlslParseContext *this,TSourceLoc *loc,TParameter *param,TIntermAggregate **paramNodes)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TVariable *variable;
  undefined4 extraout_var_00;
  TIntermSymbol *right;
  TIntermAggregate *pTVar3;
  TString counterBlockName;
  TType counterType;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_e8;
  TType local_c0;
  
  iVar2 = (*param->type->_vptr_TType[0xb])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x1fe0000) == 0x960000) {
    TIntermediate::
    addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
              (&local_e8,(this->super_TParseContextBase).super_TParseVersions.intermediate,
               param->name);
    TType::TType(&local_c0,EbtVoid,EvqTemporary,1,0,0,false);
    counterBufferType(this,loc,&local_c0);
    variable = makeInternalVariable(this,local_e8._M_dataplus._M_p,&local_c0);
    bVar1 = TSymbolTable::insert
                      ((this->super_TParseContextBase).symbolTable,&variable->super_TSymbol);
    if (!bVar1) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[3])(variable);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"redefinition",*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8),"");
    }
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar3 = *paramNodes;
    right = TIntermediate::addSymbol(this_00,variable,loc);
    pTVar3 = TIntermediate::growAggregate(this_00,(TIntermNode *)pTVar3,(TIntermNode *)right,loc);
    *paramNodes = pTVar3;
  }
  return;
}

Assistant:

void HlslParseContext::addStructBufferHiddenCounterParam(const TSourceLoc& loc, TParameter& param,
                                                         TIntermAggregate*& paramNodes)
{
    if (! hasStructBuffCounter(*param.type))
        return;

    const TString counterBlockName(intermediate.addCounterBufferName(*param.name));

    TType counterType;
    counterBufferType(loc, counterType);
    TVariable *variable = makeInternalVariable(counterBlockName, counterType);

    if (! symbolTable.insert(*variable))
        error(loc, "redefinition", variable->getName().c_str(), "");

    paramNodes = intermediate.growAggregate(paramNodes,
                                            intermediate.addSymbol(*variable, loc),
                                            loc);
}